

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mecab.cpp
# Opt level: O2

int Mecab_clear(Mecab *m)

{
  Mecab_refresh(m);
  if ((long *)m->lattice != (long *)0x0) {
    (**(code **)(*m->lattice + 0x138))();
    m->lattice = (void *)0x0;
  }
  if ((long *)m->tagger != (long *)0x0) {
    (**(code **)(*m->tagger + 0xe8))();
    m->tagger = (void *)0x0;
  }
  if ((long *)m->model != (long *)0x0) {
    (**(code **)(*m->model + 0x38))();
    m->model = (void *)0x0;
  }
  return 1;
}

Assistant:

BOOL Mecab_clear(Mecab *m)
{
   Mecab_refresh(m);

   if(m->lattice) {
      MeCab::Lattice *lattice = (MeCab::Lattice *) m->lattice;
      delete lattice;
      m->lattice = NULL;
   }

   if(m->tagger) {
      MeCab::Tagger *tagger = (MeCab::Tagger *) m->tagger;
      delete tagger;
      m->tagger = NULL;
   }

   if(m->model) {
      MeCab::Model *model = (MeCab::Model *) m->model;
      delete model;
      m->model = NULL;
   }

   return TRUE;
}